

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialBendType.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,PolynomialBendType *pbt)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  ostream *poVar4;
  _Self *__x;
  BendType *in_RSI;
  ostream *in_RDI;
  RealType RVar5;
  const_iterator i;
  Polynomial<double> *in_stack_ffffffffffffff88;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_20;
  BendType *local_18;
  ostream *local_10;
  ostream *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator(&local_20);
  local_30._M_node = (_Base_ptr)Polynomial<double>::begin(in_stack_ffffffffffffff88);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
            (&local_28,&local_30);
  local_20._M_node = local_28._M_node;
  local_40._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff88);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
            (&local_38,&local_40);
  bVar1 = std::operator==(&local_20,&local_38);
  if (bVar1) {
    poVar2 = std::operator<<(local_10,"This PolynomialBendType contains nothing");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = local_10;
  }
  else {
    poVar2 = std::operator<<(local_10,"This PolynomialBendType contains below terms:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    while( true ) {
      poVar2 = local_10;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x3cf4ae);
      poVar4 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
      poVar4 = std::operator<<(poVar4,"*");
      poVar4 = std::operator<<(poVar4,"(theta - ");
      RVar5 = BendType::getTheta(local_18);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,RVar5);
      poVar4 = std::operator<<(poVar4,")");
      poVar4 = std::operator<<(poVar4,"^");
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x3cf521);
      std::ostream::operator<<(poVar4,ppVar3->first);
      __x = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
                      ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)poVar2);
      local_50._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff88);
      std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
                (&local_48,&local_50);
      bVar1 = std::operator==(__x,&local_48);
      if (bVar1) break;
      std::operator<<(local_10," + ");
    }
    std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, PolynomialBendType& pbt) {
    DoublePolynomial::const_iterator i;

    i = pbt.polynomial_.begin();

    if (i == pbt.polynomial_.end()) {
      os << "This PolynomialBendType contains nothing" << std::endl;
      return os;
    }

    os << "This PolynomialBendType contains below terms:" << std::endl;

    while (true) {
      os << i->second << "*"
         << "(theta - " << pbt.getTheta() << ")"
         << "^" << i->first;

      if (++i == pbt.polynomial_.end()) {
        // If we reach the end of the polynomial pair, write out a
        // newline and then escape the loop
        os << std::endl;
        break;
      } else {
        // otherwise, write out a "+"
        os << " + ";
      }
    }
    return os;
  }